

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resbund.cpp
# Opt level: O2

void __thiscall
icu_63::ResourceBundle::ResourceBundle(ResourceBundle *this,UResourceBundle *res,UErrorCode *err)

{
  UResourceBundle *pUVar1;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__ResourceBundle_003b45f0;
  this->fLocale = (Locale *)0x0;
  if (res == (UResourceBundle *)0x0) {
    pUVar1 = (UResourceBundle *)0x0;
  }
  else {
    pUVar1 = ures_copyResb_63((UResourceBundle *)0x0,res,err);
  }
  this->fResource = pUVar1;
  return;
}

Assistant:

ResourceBundle::ResourceBundle(UResourceBundle *res, UErrorCode& err)
                               :UObject(), fLocale(NULL)
{
    if (res) {
        fResource = ures_copyResb(0, res, &err);
    } else {
        /* Copying a bad resource bundle */
        fResource = NULL;
    }
}